

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

void __thiscall
perfetto::internal::TrackRegistry::SerializeTrack<perfetto::CounterTrack>
          (TrackRegistry *this,CounterTrack *track,
          MessageHandle<perfetto::protos::pbzero::TracePacket> *packet)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  Message *pMVar5;
  _Base_ptr p_Var6;
  string desc_copy;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    p_Var4 = (this->tracks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      p_Var1 = &(this->tracks_)._M_t._M_impl.super__Rb_tree_header;
      uVar2 = (track->super_Track).uuid;
      p_Var6 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var4 + 1) >= uVar2) {
          p_Var6 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar2];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(ulong *)(p_Var6 + 1) <= uVar2)) {
        ::std::__cxx11::string::_M_assign((string *)&local_40);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pMVar5 = (packet->super_MessageHandleBase).message_;
    if (local_38 == 0) {
      pMVar5 = protozero::Message::BeginNestedMessageInternal(pMVar5,0x3c);
      CounterTrack::Serialize(track,(TrackDescriptor *)pMVar5);
    }
    else {
      (packet->super_MessageHandleBase).message_ = (Message *)0x0;
      protozero::Message::AppendBytes(pMVar5,0x3c,local_40,local_38);
      protozero::Message::Finalize(pMVar5);
    }
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    }
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void SerializeTrack(
      const TrackType& track,
      protozero::MessageHandle<protos::pbzero::TracePacket> packet) {
    // If the track has extra metadata (recorded with UpdateTrack), it will be
    // found in the registry. To minimize the time the lock is held, make a copy
    // of the data held in the registry and write it outside the lock.
    std::string desc_copy;
    {
      std::lock_guard<std::mutex> lock(mutex_);
      const auto& it = tracks_.find(track.uuid);
      if (it != tracks_.end()) {
        desc_copy = it->second;
        PERFETTO_DCHECK(!desc_copy.empty());
      }
    }
    if (!desc_copy.empty()) {
      WriteTrackDescriptor(std::move(desc_copy), std::move(packet));
    } else {
      // Otherwise we just write the basic descriptor for this type of track
      // (e.g., just uuid, no name).
      track.Serialize(packet->set_track_descriptor());
    }
  }